

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

uhugeint_t
duckdb::TryCastCInternal<long,duckdb::uhugeint_t,duckdb::TryCast>
          (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  uhugeint_t result_value;
  uhugeint_t local_20;
  
  bVar1 = TryCast::Operation<long,duckdb::uhugeint_t>
                    (*(int64_t *)((long)result->deprecated_columns[col].deprecated_data + row * 8),
                     &local_20,false);
  if (!bVar1) {
    local_20 = FetchDefaultValue::Operation<duckdb::uhugeint_t>();
  }
  return local_20;
}

Assistant:

void *UnsafeFetchPtr(duckdb_result *result, idx_t col, idx_t row) {
	D_ASSERT(row < result->deprecated_row_count);
	return (void *)&(((T *)result->deprecated_columns[col].deprecated_data)[row]);
}